

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vec3 __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getData_vec3
          (GLAttributeBuffer *this,size_t ind)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec3 vVar2;
  allocator local_39;
  string local_38;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar3;
  
  if ((this->super_AttributeBuffer).dataType != Vector3Float) {
    std::__cxx11::string::string((string *)&local_38,"bad getData type",&local_39);
    exception(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  vVar1 = getData_helper<glm::vec<3,float,(glm::qualifier)0>>(this,ind);
  vVar2.field_0 = vVar1.field_0;
  vVar2.field_1 = vVar1.field_1;
  register0x00001240 = vVar1.field_2;
  return vVar2;
}

Assistant:

glm::vec3 GLAttributeBuffer::getData_vec3(size_t ind) {
  if (getType() != RenderDataType::Vector3Float) exception("bad getData type");
  return getData_helper<glm::vec3>(ind);
}